

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# flatbuffers.h
# Opt level: O0

uoffset_t __thiscall
flatbuffers::FlatBufferBuilder::EndTable
          (FlatBufferBuilder *this,uoffset_t start,voffset_t numfields)

{
  bool bVar1;
  voffset_t element;
  unsigned_short uVar2;
  int iVar3;
  uoffset_t uVar4;
  uoffset_t uVar5;
  pointer pFVar6;
  ushort *__s2;
  reference puVar7;
  uint8_t *puVar8;
  __normal_iterator<unsigned_int_*,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>
  local_58;
  __normal_iterator<unsigned_int_*,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>
  local_50;
  iterator it;
  uoffset_t vt_use;
  voffset_t vt1_size;
  voffset_t *vt1;
  iterator iStack_30;
  uoffset_t pos;
  __normal_iterator<flatbuffers::FlatBufferBuilder::FieldLoc_*,_std::vector<flatbuffers::FlatBufferBuilder::FieldLoc,_std::allocator<flatbuffers::FlatBufferBuilder::FieldLoc>_>_>
  local_28;
  iterator field_location;
  uoffset_t table_object_size;
  uoffset_t vtableoffsetloc;
  voffset_t numfields_local;
  uoffset_t start_local;
  FlatBufferBuilder *this_local;
  
  field_location._M_current._4_4_ = PushElement<unsigned_int>(this,0);
  vector_downward::fill(&this->buf_,(ulong)numfields << 1);
  field_location._M_current._0_4_ = field_location._M_current._4_4_ - start;
  if (0xffff < (uint)field_location._M_current) {
    __assert_fail("table_object_size < 0x10000",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/AlexStocks[P]flatbuffers/include/flatbuffers/flatbuffers.h"
                  ,0x199,"uoffset_t flatbuffers::FlatBufferBuilder::EndTable(uoffset_t, voffset_t)")
    ;
  }
  PushElement<unsigned_short>(this,(unsigned_short)(uint)field_location._M_current);
  element = FieldIndexToOffset(numfields);
  PushElement<unsigned_short>(this,element);
  local_28._M_current =
       (FieldLoc *)
       std::
       vector<flatbuffers::FlatBufferBuilder::FieldLoc,_std::allocator<flatbuffers::FlatBufferBuilder::FieldLoc>_>
       ::begin(&this->offsetbuf_);
  while( true ) {
    iStack_30 = std::
                vector<flatbuffers::FlatBufferBuilder::FieldLoc,_std::allocator<flatbuffers::FlatBufferBuilder::FieldLoc>_>
                ::end(&this->offsetbuf_);
    bVar1 = __gnu_cxx::operator!=(&local_28,&stack0xffffffffffffffd0);
    uVar4 = field_location._M_current._4_4_;
    if (!bVar1) break;
    pFVar6 = __gnu_cxx::
             __normal_iterator<flatbuffers::FlatBufferBuilder::FieldLoc_*,_std::vector<flatbuffers::FlatBufferBuilder::FieldLoc,_std::allocator<flatbuffers::FlatBufferBuilder::FieldLoc>_>_>
             ::operator->(&local_28);
    uVar5 = pFVar6->off;
    puVar8 = vector_downward::data(&this->buf_);
    pFVar6 = __gnu_cxx::
             __normal_iterator<flatbuffers::FlatBufferBuilder::FieldLoc_*,_std::vector<flatbuffers::FlatBufferBuilder::FieldLoc,_std::allocator<flatbuffers::FlatBufferBuilder::FieldLoc>_>_>
             ::operator->(&local_28);
    uVar2 = ReadScalar<unsigned_short>(puVar8 + (int)(uint)pFVar6->id);
    if (uVar2 != 0) {
      __assert_fail("!ReadScalar<voffset_t>(buf_.data() + field_location->id)",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/AlexStocks[P]flatbuffers/include/flatbuffers/flatbuffers.h"
                    ,0x1a2,
                    "uoffset_t flatbuffers::FlatBufferBuilder::EndTable(uoffset_t, voffset_t)");
    }
    puVar8 = vector_downward::data(&this->buf_);
    pFVar6 = __gnu_cxx::
             __normal_iterator<flatbuffers::FlatBufferBuilder::FieldLoc_*,_std::vector<flatbuffers::FlatBufferBuilder::FieldLoc,_std::allocator<flatbuffers::FlatBufferBuilder::FieldLoc>_>_>
             ::operator->(&local_28);
    WriteScalar<unsigned_short>(puVar8 + (int)(uint)pFVar6->id,(short)uVar4 - (short)uVar5);
    __gnu_cxx::
    __normal_iterator<flatbuffers::FlatBufferBuilder::FieldLoc_*,_std::vector<flatbuffers::FlatBufferBuilder::FieldLoc,_std::allocator<flatbuffers::FlatBufferBuilder::FieldLoc>_>_>
    ::operator++(&local_28);
  }
  std::
  vector<flatbuffers::FlatBufferBuilder::FieldLoc,_std::allocator<flatbuffers::FlatBufferBuilder::FieldLoc>_>
  ::clear(&this->offsetbuf_);
  __s2 = (ushort *)vector_downward::data(&this->buf_);
  it._M_current._6_2_ = *__s2;
  it._M_current._0_4_ = GetSize(this);
  local_50._M_current =
       (uint *)std::vector<unsigned_int,_std::allocator<unsigned_int>_>::begin(&this->vtables_);
  do {
    local_58._M_current =
         (uint *)std::vector<unsigned_int,_std::allocator<unsigned_int>_>::end(&this->vtables_);
    bVar1 = __gnu_cxx::operator!=(&local_50,&local_58);
    if (!bVar1) {
LAB_00138216:
      uVar4 = (uoffset_t)it._M_current;
      uVar5 = GetSize(this);
      if (uVar4 == uVar5) {
        std::vector<unsigned_int,_std::allocator<unsigned_int>_>::push_back
                  (&this->vtables_,(value_type_conflict1 *)&it);
      }
      puVar8 = vector_downward::data_at(&this->buf_,(ulong)field_location._M_current._4_4_);
      WriteScalar<int>(puVar8,(uoffset_t)it._M_current - field_location._M_current._4_4_);
      return field_location._M_current._4_4_;
    }
    puVar7 = __gnu_cxx::
             __normal_iterator<unsigned_int_*,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>
             ::operator*(&local_50);
    puVar8 = vector_downward::data_at(&this->buf_,(ulong)*puVar7);
    iVar3 = memcmp(puVar8,__s2,(ulong)it._M_current._6_2_);
    if (iVar3 == 0) {
      puVar7 = __gnu_cxx::
               __normal_iterator<unsigned_int_*,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>
               ::operator*(&local_50);
      it._M_current._0_4_ = *puVar7;
      uVar4 = GetSize(this);
      vector_downward::pop(&this->buf_,(ulong)(uVar4 - field_location._M_current._4_4_));
      goto LAB_00138216;
    }
    __gnu_cxx::
    __normal_iterator<unsigned_int_*,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>::
    operator++(&local_50);
  } while( true );
}

Assistant:

uoffset_t EndTable(uoffset_t start, voffset_t numfields) {
    // Write the vtable offset, which is the start of any Table.
    // We fill it's value later.
    auto vtableoffsetloc = PushElement<uoffset_t>(0);
    // Write a vtable, which consists entirely of voffset_t elements.
    // It starts with the number of offsets, followed by a type id, followed
    // by the offsets themselves. In reverse:
    buf_.fill(numfields * sizeof(voffset_t));
    auto table_object_size = vtableoffsetloc - start;
    assert(table_object_size < 0x10000);  // Vtable use 16bit offsets.
    PushElement<voffset_t>(table_object_size);
    PushElement<voffset_t>(FieldIndexToOffset(numfields));
    // Write the offsets into the table
    for (auto field_location = offsetbuf_.begin();
              field_location != offsetbuf_.end();
            ++field_location) {
      auto pos = (vtableoffsetloc - field_location->off);
      // If this asserts, it means you've set a field twice.
      assert(!ReadScalar<voffset_t>(buf_.data() + field_location->id));
      WriteScalar<voffset_t>(buf_.data() + field_location->id, pos);
    }
    offsetbuf_.clear();
    auto vt1 = reinterpret_cast<voffset_t *>(buf_.data());
    auto vt1_size = *vt1;
    auto vt_use = GetSize();
    // See if we already have generated a vtable with this exact same
    // layout before. If so, make it point to the old one, remove this one.
    for (auto it = vtables_.begin(); it != vtables_.end(); ++it) {
      if (memcmp(buf_.data_at(*it), vt1, vt1_size)) continue;
      vt_use = *it;
      buf_.pop(GetSize() - vtableoffsetloc);
      break;
    }
    // If this is a new vtable, remember it.
    if (vt_use == GetSize()) {
      vtables_.push_back(vt_use);
    }
    // Fill the vtable offset we created above.
    // The offset points from the beginning of the object to where the
    // vtable is stored.
    // Offsets default direction is downward in memory for future format
    // flexibility (storing all vtables at the start of the file).
    WriteScalar(buf_.data_at(vtableoffsetloc),
                static_cast<soffset_t>(vt_use) -
                  static_cast<soffset_t>(vtableoffsetloc));
    return vtableoffsetloc;
  }